

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.hpp
# Opt level: O0

TimeAggregate * __thiscall
hta::storage::file::File<hta::storage::file::Metric::Header,_hta::TimeAggregate>::
read<hta::TimeAggregate>
          (TimeAggregate *__return_storage_ptr__,
          File<hta::storage::file::Metric::Header,_hta::TimeAggregate> *this)

{
  TimeAggregate *thing;
  File<hta::storage::file::Metric::Header,_hta::TimeAggregate> *this_local;
  
  TimeAggregate::TimeAggregate(__return_storage_ptr__);
  std::istream::read((char *)&this->stream_,(long)__return_storage_ptr__);
  check_stream(this,"read");
  return __return_storage_ptr__;
}

Assistant:

TT read()
    {
        static_assert(std::is_trivially_copyable_v<TT>, "Type must be a trivially copyable.");
        TT thing;
        stream_.read(reinterpret_cast<char*>(&thing), sizeof(thing));
        check_stream("read");
        return thing;
    }